

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlParserErrors
xmlCreateCharEncodingHandler
          (char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,void *implCtxt,
          xmlCharEncodingHandler **out)

{
  xmlCharEncoding xVar1;
  xmlParserErrors xVar2;
  char *name_00;
  
  xVar2 = XML_ERR_ARGUMENT;
  if ((out != (xmlCharEncodingHandler **)0x0) &&
     (*out = (xmlCharEncodingHandler *)0x0, flags != 0 && name != (char *)0x0)) {
    name_00 = xmlGetEncodingAlias(name);
    if (name_00 == (char *)0x0) {
      name_00 = name;
    }
    xVar1 = xmlParseCharEncodingInternal(name_00);
    xVar2 = XML_ERR_OK;
    if (xVar1 != XML_CHAR_ENCODING_UTF8) {
      if ((uint)(xVar1 + XML_CHAR_ENCODING_ERROR) < 0x1e) {
        if ((((flags & XML_ENC_INPUT) == 0) ||
            (defaultHandlers[(uint)xVar1].input.func != (xmlCharEncConvFunc)0x0)) &&
           (((flags & XML_ENC_OUTPUT) == 0 ||
            (defaultHandlers[(uint)xVar1].output.func != (xmlCharEncConvFunc)0x0)))) {
          *out = defaultHandlers + (uint)xVar1;
          return XML_ERR_OK;
        }
      }
      xVar2 = xmlFindExtraHandler(name,name_00,flags,impl,implCtxt,out);
      return xVar2;
    }
  }
  return xVar2;
}

Assistant:

xmlParserErrors
xmlCreateCharEncodingHandler(const char *name, xmlCharEncFlags flags,
                             xmlCharEncConvImpl impl, void *implCtxt,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;
    const char *norig, *nalias;
    xmlCharEncoding enc;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((name == NULL) || (flags == 0))
        return(XML_ERR_ARGUMENT);

    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    enc = xmlParseCharEncodingInternal(name);

    /* Return NULL handler for UTF-8 */
    if (enc == XML_CHAR_ENCODING_UTF8)
        return(XML_ERR_OK);

    if ((enc > 0) && ((size_t) enc < NUM_DEFAULT_HANDLERS)) {
        handler = &defaultHandlers[enc];
        if ((((flags & XML_ENC_INPUT) == 0) || (handler->input.func)) &&
            (((flags & XML_ENC_OUTPUT) == 0) || (handler->output.func))) {
            *out = (xmlCharEncodingHandler *) handler;
            return(XML_ERR_OK);
        }
    }

    return(xmlFindExtraHandler(norig, name, flags, impl, implCtxt, out));
}